

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  int iVar1;
  lys_module *plVar2;
  uint local_54;
  lys_module *plStack_50;
  int i;
  lys_module *latest_mod;
  lys_module *mod;
  unres_schema *unres_local;
  int implement_local;
  char *revision_local;
  char *name_local;
  lys_module *module_local;
  ly_ctx *ctx_local;
  
  latest_mod = (lys_module *)0x0;
  plStack_50 = (lys_module *)0x0;
  if (module == (lys_module *)0x0) {
    for (local_54 = 0; (int)local_54 < (int)(uint)ctx->internal_module_count;
        local_54 = local_54 + 1) {
      iVar1 = ly_strequal_(name,internal_modules[(int)local_54].name);
      if ((iVar1 != 0) &&
         ((revision == (char *)0x0 ||
          (iVar1 = ly_strequal_(revision,internal_modules[(int)local_54].revision), iVar1 != 0)))) {
        plVar2 = ly_ctx_get_module(ctx,name,revision,0);
        return plVar2;
      }
    }
    for (local_54 = (uint)ctx->internal_module_count; latest_mod = (lys_module *)0x0,
        (int)local_54 < (ctx->models).used; local_54 = local_54 + 1) {
      latest_mod = (ctx->models).list[(int)local_54];
      iVar1 = ly_strequal_(name,latest_mod->name);
      if (iVar1 != 0) {
        plVar2 = latest_mod;
        if ((((plStack_50 != (lys_module *)0x0) &&
             (plVar2 = plStack_50, latest_mod->rev_size != '\0')) && (plStack_50->rev_size != '\0'))
           && (iVar1 = strcmp(latest_mod->rev->date,plStack_50->rev->date), 0 < iVar1)) {
          plVar2 = latest_mod;
        }
        plStack_50 = plVar2;
        if (((((revision != (char *)0x0) && (latest_mod->rev_size != '\0')) &&
             (iVar1 = strcmp(revision,latest_mod->rev->date), iVar1 == 0)) ||
            ((revision == (char *)0x0 && ((*(ushort *)&latest_mod->field_0x40 & 0x100) != 0)))) ||
           ((implement != 0 &&
            (((*(ushort *)&latest_mod->field_0x40 >> 7 & 1) != 0 && (revision == (char *)0x0))))))
        break;
      }
    }
    if (latest_mod != (lys_module *)0x0) {
      if ((*(ushort *)&latest_mod->field_0x40 >> 6 & 1) != 0) {
        lys_set_enabled(latest_mod);
      }
      if ((implement != 0) && (iVar1 = lys_set_implemented(latest_mod), iVar1 != 0)) {
        latest_mod = (lys_module *)0x0;
      }
      return latest_mod;
    }
  }
  if (ctx->imp_clb == (ly_module_imp_clb)0x0) goto LAB_0010d7d6;
  if (((ctx->models).flags & 0x20U) != 0) goto LAB_0010d7d6;
  while( true ) {
    if (ctx->imp_clb != (ly_module_imp_clb)0x0) {
      latest_mod = ly_ctx_load_sub_module_clb(ctx,module,name,revision,implement,unres);
    }
    if ((latest_mod != (lys_module *)0x0) || (((ctx->models).flags & 0x20U) != 0)) break;
LAB_0010d7d6:
    if (((ctx->models).flags & 8U) == 0) {
      latest_mod = ly_ctx_load_localfile(ctx,module,name,revision,implement,unres);
    }
    if ((latest_mod != (lys_module *)0x0) || (((ctx->models).flags & 0x20U) == 0)) break;
  }
  if ((latest_mod == (lys_module *)0x0) && (plStack_50 != (lys_module *)0x0)) {
    latest_mod = plStack_50;
  }
  if ((revision == (char *)0x0) && (latest_mod != (lys_module *)0x0)) {
    *(ushort *)&latest_mod->field_0x40 = *(ushort *)&latest_mod->field_0x40 & 0xfeff | 0x100;
  }
  return latest_mod;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    struct lys_module *mod = NULL, *latest_mod = NULL;
    int i;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < ctx->internal_module_count; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision, 0);
                }
            }
        }
        /* try to get the schema from the context (with or without revision),
         * include the disabled modules in the search to avoid their duplication,
         * they are enabled by the subsequent call to lys_set_implemented() */
        for (i = ctx->internal_module_count, mod = NULL; i < ctx->models.used; i++) {
            mod = ctx->models.list[i]; /* shortcut */
            if (ly_strequal(name, mod->name, 0)) {
                /* first remember latest module if no other is found */
                if (!latest_mod) {
                    latest_mod = mod;
                } else {
                    if (mod->rev_size && latest_mod->rev_size && (strcmp(mod->rev[0].date, latest_mod->rev[0].date) > 0)) {
                        /* newer revision */
                        latest_mod = mod;
                    }
                }

                if (revision && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    /* the specific revision was already loaded */
                    break;
                } else if (!revision && mod->latest_revision) {
                    /* the latest revision of this module was already loaded */
                    break;
                } else if (implement && mod->implemented && !revision) {
                    /* we are not able to implement another module, so consider this module as the latest one */
                    break;
                }
            }
            mod = NULL;
        }
        if (mod) {
            /* module must be enabled */
            if (mod->disabled) {
                lys_set_enabled(mod);
            }
            /* module is supposed to be implemented */
            if (implement && lys_set_implemented(mod)) {
                /* the schema cannot be implemented */
                mod = NULL;
            }
            return mod;
        }
    }

    /* module is not yet in context, use the user callback or try to find the schema on our own */
    if (ctx->imp_clb && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
        if (ctx->imp_clb) {
            mod = ly_ctx_load_sub_module_clb(ctx, module, name, revision, implement, unres);
        }
        if (!mod && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_file;
        }
    } else {
search_file:
        if (!(ctx->models.flags & LY_CTX_DISABLE_SEARCHDIRS)) {
            /* module was not received from the callback or there is no callback set */
            mod = ly_ctx_load_localfile(ctx, module, name, revision, implement, unres);
        }
        if (!mod && (ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_clb;
        }
    }

    if (!mod && latest_mod) {
        /* consider the latest mod found as the latest available */
        mod = latest_mod;
    }

#ifdef LY_ENABLED_LATEST_REVISIONS
    if (!revision && mod) {
        /* module is the latest revision found */
        mod->latest_revision = 1;
    }
#endif

    return mod;
}